

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void __thiscall wasm::HeapType::HeapType(HeapType *this,Array *array)

{
  HeapType HVar1;
  undefined1 local_20 [16];
  Array *array_local;
  HeapType *this_local;
  
  local_20._8_8_ = array;
  array_local = (Array *)this;
  std::make_unique<wasm::(anonymous_namespace)::HeapTypeInfo,wasm::Array&>((Array *)local_20);
  HVar1 = anon_unknown_0::RecGroupStore::insert
                    ((RecGroupStore *)wasm::(anonymous_namespace)::globalRecGroupStore,
                     (unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                      *)local_20);
  this->id = (uintptr_t)HVar1;
  std::
  unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
  ::~unique_ptr((unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                 *)local_20);
  return;
}

Assistant:

HeapType::HeapType(Array array) {
  new (this)
    HeapType(globalRecGroupStore.insert(std::make_unique<HeapTypeInfo>(array)));
}